

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_allocator.h
# Opt level: O0

pointer __thiscall
cppcms::impl::
basic_allocator<cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>,_char>
::allocate(basic_allocator<cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>,_char>
           *this,size_type cnt,const_pointer param_3)

{
  shmem_allocator<char,_cppcms::impl::process_settings::process_memory> *this_00;
  bad_alloc *this_01;
  undefined8 uVar1;
  size_t in_RSI;
  basic_allocator<cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>,_char>
  *in_RDI;
  void *memory;
  
  this_00 = self(in_RDI);
  this_01 = (bad_alloc *)
            shmem_allocator<char,_cppcms::impl::process_settings::process_memory>::malloc
                      (this_00,in_RSI);
  if (this_01 == (bad_alloc *)0x0) {
    uVar1 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_01);
    __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return (pointer)this_01;
}

Assistant:

pointer allocate(size_type cnt, std::allocator<void>::const_pointer = 0) const
	{
		void *memory=self().malloc(cnt*sizeof(T));
		if(!memory) {
			throw std::bad_alloc();
		}
		return (pointer)memory;
	}